

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDrawLine(Image *dst,int startPosX,int startPosY,int endPosX,int endPosY,Color color)

{
  int iVar1;
  undefined4 local_38;
  undefined4 local_34;
  int y;
  int x;
  int slopeError;
  int m;
  int endPosY_local;
  int endPosX_local;
  int startPosY_local;
  int startPosX_local;
  Image *dst_local;
  Color color_local;
  
  iVar1 = (endPosY - startPosY) * 2;
  y = iVar1 - (endPosX - startPosX);
  local_38 = startPosY;
  for (local_34 = startPosX; local_34 <= endPosX; local_34 = local_34 + 1) {
    ImageDrawPixel(dst,local_34,local_38,color);
    y = iVar1 + y;
    if (-1 < y) {
      local_38 = local_38 + 1;
      y = y + (endPosX - startPosX) * -2;
    }
  }
  return;
}

Assistant:

void ImageDrawLine(Image *dst, int startPosX, int startPosY, int endPosX, int endPosY, Color color)
{
    int m = 2*(endPosY - startPosY);
    int slopeError = m - (endPosX - startPosX);

    for (int x = startPosX, y = startPosY; x <= endPosX; x++)
    {
        ImageDrawPixel(dst, x, y, color);
        slopeError += m;

        if (slopeError >= 0)
        {
            y++;
            slopeError -= 2*(endPosX - startPosX);
        }
    }
}